

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O1

void anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  string name;
  is_new_style_constructor local_71;
  class_<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
  local_70;
  long *local_68;
  long local_58 [2];
  code *local_48;
  undefined8 local_40;
  arg local_38;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
  ::class_<>(&local_70,(m->super_object).super_handle.m_ptr,(char *)local_68);
  local_28.name = "geometry";
  local_28._8_1_ = 2;
  local_38.name = "domain";
  local_38._8_1_ = 2;
  pybind11::
  class_<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_anurbs::CurveBase<2L>,_std::shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg>
            (&local_70,"__init__",(type *)&local_48,&local_71,&local_28,&local_38);
  local_48 = Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::curve_geometry;
  local_40 = 0;
  pybind11::
  class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
  ::
  def<anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>(anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>::*)()const>
            ((class_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::CurveBase<2l>,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
              *)&local_70,"curve_geometry",(offset_in_Model_to_subr *)&local_48);
  pybind11::object::~object((object *)&local_70);
  Model::register_python_data_type<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>
            (m,model);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Curve<TDimension, TRef>;
        using Holder = Pointer<Type>;
        using Base = CurveBase<TDimension>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TRef, Interval>(), "geometry"_a, "domain"_a)
            .def("curve_geometry", &Type::curve_geometry)
        ;

        Model::register_python_data_type<Type>(m, model);
    }